

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O3

void Dch_CnfNodeAddToSolver(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  size_t sVar1;
  Aig_Obj_t *pNode;
  int iVar2;
  Vec_Ptr_t *vFrontier;
  void **ppvVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  
  if (p->pSatVars[pObj->Id] != 0) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFrontier->pArray = ppvVar3;
  Dch_ObjAddToFrontier(p,pObj,vFrontier);
  if (0 < vFrontier->nSize) {
    lVar8 = 0;
    do {
      pNode = (Aig_Obj_t *)vFrontier->pArray[lVar8];
      if (p->pSatVars[pNode->Id] == 0) {
        __assert_fail("Dch_ObjSatNum(p,pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/dch/dchCnf.c"
                      ,0x12e,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
      }
      iVar2 = Aig_ObjIsMuxType(pNode);
      pVVar5 = p->vFanins;
      if (iVar2 == 0) {
        Dch_CollectSuper(pNode,1,pVVar5);
        pVVar5 = p->vFanins;
        if (0 < pVVar5->nSize) {
          lVar10 = 0;
          do {
            Dch_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)pVVar5->pArray[lVar10] & 0xfffffffffffffffe),vFrontier
                      );
            lVar10 = lVar10 + 1;
            pVVar5 = p->vFanins;
          } while (lVar10 < pVVar5->nSize);
        }
        Dch_AddClausesSuper(p,pNode,pVVar5);
      }
      else {
        pVVar5->nSize = 0;
        uVar6 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8);
        iVar2 = 0;
        ppvVar3 = pVVar5->pArray;
        if (pVVar5->nCap == 0) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
            iVar2 = 0;
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
            iVar2 = pVVar5->nSize;
          }
          pVVar5->pArray = ppvVar3;
          pVVar5->nCap = 0x10;
        }
        pVVar5->nSize = iVar2 + 1;
        ppvVar3[iVar2] = (void *)(uVar6 & 0xfffffffffffffffe);
        pVVar5 = p->vFanins;
        pvVar9 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                         0xfffffffffffffffe);
        uVar7 = pVVar5->nSize;
        uVar6 = (ulong)uVar7;
        if (0 < (int)uVar7) {
          uVar4 = 0;
          do {
            if (pVVar5->pArray[uVar4] == pvVar9) goto LAB_0090e28d;
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
        if (uVar7 == pVVar5->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar6 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,uVar6 << 4);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar3 = pVVar5->pArray;
        }
        iVar2 = pVVar5->nSize;
        pVVar5->nSize = iVar2 + 1;
        ppvVar3[iVar2] = pvVar9;
        pVVar5 = p->vFanins;
        uVar6 = (ulong)(uint)pVVar5->nSize;
LAB_0090e28d:
        pvVar9 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar7 = (uint)uVar6;
        if (0 < (int)uVar7) {
          uVar4 = 0;
          do {
            if (pVVar5->pArray[uVar4] == pvVar9) goto LAB_0090e343;
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
        if (uVar7 == pVVar5->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar7 * 2) * 8;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(sVar1);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,sVar1);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar3 = pVVar5->pArray;
        }
        iVar2 = pVVar5->nSize;
        pVVar5->nSize = iVar2 + 1;
        ppvVar3[iVar2] = pvVar9;
        pVVar5 = p->vFanins;
        uVar7 = pVVar5->nSize;
LAB_0090e343:
        pvVar9 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        if (0 < (int)uVar7) {
          uVar6 = 0;
          do {
            if (pVVar5->pArray[uVar6] == pvVar9) goto LAB_0090e406;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        if (uVar7 == pVVar5->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar7 * 2) * 8;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(sVar1);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar5->pArray,sVar1);
            }
            pVVar5->pArray = ppvVar3;
            pVVar5->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar3 = pVVar5->pArray;
        }
        iVar2 = pVVar5->nSize;
        pVVar5->nSize = iVar2 + 1;
        ppvVar3[iVar2] = pvVar9;
        pVVar5 = p->vFanins;
        if (0 < pVVar5->nSize) {
LAB_0090e406:
          lVar10 = 0;
          do {
            Dch_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)pVVar5->pArray[lVar10] & 0xfffffffffffffffe),vFrontier
                      );
            lVar10 = lVar10 + 1;
            pVVar5 = p->vFanins;
          } while (lVar10 < pVVar5->nSize);
        }
        Dch_AddClausesMux(p,pNode);
      }
      if (p->vFanins->nSize < 2) {
        __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/dch/dchCnf.c"
                      ,0x141,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
  }
  free(vFrontier);
  return;
}

Assistant:

void Dch_CnfNodeAddToSolver( Dch_Man_t * p, Aig_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Dch_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Dch_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesMux( p, pNode );
        }
        else
        {
            Dch_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}